

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::FindKey
          (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this,
          FString *key)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  FString FStack_28;
  
  FString::AttachToOther(&FStack_28,key);
  pNVar2 = MainPosition(this,&FStack_28);
  FString::~FString(&FStack_28);
  do {
    pNVar3 = pNVar2;
    if (pNVar3 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar2 = (Node *)0x1;
    if (pNVar3->Next == (Node *)0x1) break;
    iVar1 = FString::Compare(&(pNVar3->Pair).Key,key);
    pNVar2 = pNVar3->Next;
  } while (iVar1 != 0);
  if (pNVar2 == (Node *)0x1) {
    pNVar3 = (Node *)0x0;
  }
  return pNVar3;
}

Assistant:

Node *FindKey(const KT key)
	{
		HashTraits Traits;
		Node *n = MainPosition(key);
		while (n != NULL && !n->IsNil() && Traits.Compare(n->Pair.Key, key))
		{
			n = n->Next;
		}
		return n == NULL || n->IsNil() ? NULL : n;
	}